

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManLutNum(Gia_Man_t *p)

{
  int iVar1;
  int Counter;
  int iVar2;
  int i;
  int Id;
  
  iVar2 = 0;
  for (Id = 1; Id < p->nObjs; Id = Id + 1) {
    iVar1 = Gia_ObjIsLut(p,Id);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Gia_ManLutNum( Gia_Man_t * p )
{
    int i, Counter = 0;
    Gia_ManForEachLut( p, i )
        Counter ++;
    return Counter;
}